

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O1

BtorSimBitVector * btorsim_bv_new(uint32_t bw)

{
  byte bVar1;
  BtorSimBitVector *pBVar2;
  uint in_ECX;
  int extraout_EDX;
  uint uVar3;
  uint32_t in_ESI;
  BtorSimRNG *rng;
  uint32_t uVar4;
  long lVar5;
  ulong __n;
  uint uVar6;
  
  uVar4 = ((bw >> 5) + 1) - (uint)((bw & 0x1f) == 0);
  __n = (ulong)(uVar4 * 4);
  rng = (BtorSimRNG *)(__n + 8);
  pBVar2 = (BtorSimBitVector *)malloc((size_t)rng);
  if (pBVar2 != (BtorSimBitVector *)0x0) {
    memset(pBVar2 + 1,0,__n);
    pBVar2->len = uVar4;
    pBVar2->width = bw;
    return pBVar2;
  }
  btorsim_bv_new_cold_1();
  pBVar2 = btorsim_bv_new(in_ESI);
  uVar6 = pBVar2->len;
  if (1 < (ulong)uVar6) {
    lVar5 = 0;
    do {
      uVar4 = btorsim_rng_rand(rng);
      (&pBVar2[1].len)[lVar5] = uVar4;
      lVar5 = lVar5 + 1;
    } while ((ulong)uVar6 - 1 != lVar5);
  }
  uVar6 = 0;
  uVar4 = btorsim_rng_pick_rand(rng,0,0xfffffffe);
  pBVar2[1].width = uVar4;
  if (in_ECX != 0) {
    do {
      bVar1 = (byte)uVar6 & 0x1f;
      (&pBVar2[1].width)[~(uVar6 >> 5) + pBVar2->len] =
           (&pBVar2[1].width)[~(uVar6 >> 5) + pBVar2->len] &
           (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
      uVar6 = uVar6 + 1;
    } while (in_ECX != uVar6);
  }
  uVar6 = pBVar2->width;
  uVar3 = extraout_EDX + 1;
  if (uVar3 < uVar6) {
    do {
      bVar1 = (byte)uVar3 & 0x1f;
      (&pBVar2[1].width)[~(uVar3 >> 5) + pBVar2->len] =
           (&pBVar2[1].width)[~(uVar3 >> 5) + pBVar2->len] &
           (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
      uVar3 = uVar3 + 1;
    } while (uVar6 != uVar3);
  }
  if ((ulong)pBVar2->len << 5 != (ulong)uVar6) {
    pBVar2[1].width = pBVar2[1].width & 0x7fffffffU >> (~(byte)uVar6 & 0x1f);
  }
  return pBVar2;
}

Assistant:

BtorSimBitVector *
btorsim_bv_new (uint32_t bw)
{
  assert (bw > 0);

  uint32_t i;
  BtorSimBitVector *res;

  i = bw / BTORSIM_BV_TYPE_BW;
  if (bw % BTORSIM_BV_TYPE_BW > 0) i += 1;

  assert (i > 0);
  res =
      btorsim_malloc (sizeof (BtorSimBitVector) + sizeof (BTORSIM_BV_TYPE) * i);
  memset (res->bits, 0, i * sizeof *(res->bits));
  res->len = i;
  assert (res->len);
  res->width = bw;
  return res;
}